

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRC16.cpp
# Opt level: O1

void __thiscall CRC16::CRC16(CRC16 *this,void *buf,size_t len,uint16_t init_)

{
  size_t sVar1;
  ulong uVar2;
  ushort uVar3;
  
  uVar2 = (ulong)init_;
  this->m_crc = 0xffff;
  std::call_once<void(&)()>(&flag,init_crc_table);
  this->m_crc = init_;
  if (len != 0) {
    sVar1 = 0;
    do {
      uVar3 = (ushort)((int)uVar2 << 8) ^
              s_crc_lookup._M_elems[(uint)(uVar2 >> 8) ^ (uint)*(byte *)((long)buf + sVar1)];
      uVar2 = (ulong)uVar3;
      this->m_crc = uVar3;
      sVar1 = sVar1 + 1;
    } while (len != sVar1);
  }
  return;
}

Assistant:

CRC16::CRC16(const void* buf, size_t len, uint16_t init_)
{
    std::call_once(flag, init_crc_table);
    init(init_);
    add(buf, len);
}